

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.hpp
# Opt level: O2

size_t io::
       copy<io::basic_string_stream<char,std::char_traits<char>>&,io::basic_string_stream<char,std::char_traits<char>>&,void>
                 (basic_string_stream<char,_std::char_traits<char>_> *src,
                 basic_string_stream<char,_std::char_traits<char>_> *dest)

{
  size_t sVar1;
  system_error *this;
  error_code __ec;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  sVar1 = copy<io::basic_string_stream<char,std::char_traits<char>>&,io::basic_string_stream<char,std::char_traits<char>>&,void>
                    (src,dest,&ec);
  if (ec._M_value == 0) {
    return sVar1;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  __ec._4_4_ = 0;
  __ec._M_value = ec._M_value;
  __ec._M_cat = ec._M_cat;
  std::system_error::system_error(this,__ec);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

std::size_t copy(ReadStream&& src, WriteStream&& dest)
{
    std::error_code ec;
    std::size_t bytes_copied = io::copy(std::forward<ReadStream>(src),
                                        std::forward<WriteStream>(dest),
                                        ec);
    if (ec) {
        throw std::system_error{ec};
    }
    return bytes_copied;
}